

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O2

c_v128 c_v128_add_64(c_v128 a,c_v128 b)

{
  c_v128 cVar1;
  
  cVar1.u64[1] = b.u64[1] + a.u64[1];
  cVar1.u64[0] = a.u64[0] + b.u64[0];
  return cVar1;
}

Assistant:

SIMD_INLINE c_v128 c_v128_add_64(c_v128 a, c_v128 b) {
  // Two complement overflow (silences sanitizers)
  return c_v128_from_64(
      a.v64[1].u64 > ~b.v64[1].u64 ? a.v64[1].u64 - ~b.v64[1].u64 - 1
                                   : a.v64[1].u64 + b.v64[1].u64,
      a.v64[0].u64 > ~b.v64[0].u64 ? a.v64[0].u64 - ~b.v64[0].u64 - 1
                                   : a.v64[0].u64 + b.v64[0].u64);
}